

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::HeapArgumentsObject::GetPropertyQuery
          (HeapArgumentsObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  int iVar2;
  PropertyQueryFlags PVar3;
  RecyclableObject *pRVar4;
  uint local_34 [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr,propertyId,local_34);
  if (((BVar1 != 0) && (local_34[0] < (*(uint *)&this->field_0x20 & 0x7fffffff))) &&
     (iVar2 = (*(this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x70])(this,(ulong)local_34[0],value,requestContext), iVar2 != 0)) {
    return Property_Found;
  }
  PVar3 = DynamicObject::GetPropertyQuery
                    ((DynamicObject *)this,originalInstance,propertyId,value,info,requestContext);
  if (PVar3 != Property_Found) {
    pRVar4 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar4;
  }
  return (uint)(PVar3 == Property_Found);
}

Assistant:

PropertyQueryFlags HeapArgumentsObject::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext *scriptContext = GetScriptContext();

        // Try to get a numbered property that maps to an actual argument.
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            if (this->GetItemAt(index, value, requestContext))
            {
                return PropertyQueryFlags::Property_Found;
            }
        }

        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext)))
        {
            // Property has been pre-set and not deleted. Use it.
            return PropertyQueryFlags::Property_Found;
        }

        *value = requestContext->GetMissingPropertyResult();
        return PropertyQueryFlags::Property_NotFound;
    }